

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Load * __thiscall
wasm::Builder::makeLoad
          (Builder *this,uint bytes,bool signed_,Address offset,uint align,Expression *ptr,Type type
          ,Name memory)

{
  Load *pLVar1;
  Load *ret;
  Expression *ptr_local;
  uint align_local;
  bool signed__local;
  uint bytes_local;
  Builder *this_local;
  Type type_local;
  Address offset_local;
  
  pLVar1 = MixedArena::alloc<wasm::Load>((MixedArena *)(this->wasm + 0x200));
  pLVar1->isAtomic = false;
  pLVar1->bytes = (uint8_t)bytes;
  pLVar1->signed_ = signed_;
  (pLVar1->offset).addr = offset.addr;
  Address::operator=(&pLVar1->align,(ulong)align);
  pLVar1->ptr = ptr;
  (pLVar1->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = type.id;
  Name::operator=(&pLVar1->memory,&memory);
  wasm::Load::finalize();
  return pLVar1;
}

Assistant:

Load* makeLoad(unsigned bytes,
                 bool signed_,
                 Address offset,
                 unsigned align,
                 Expression* ptr,
                 Type type,
                 Name memory) {
    auto* ret = wasm.allocator.alloc<Load>();
    ret->isAtomic = false;
    ret->bytes = bytes;
    ret->signed_ = signed_;
    ret->offset = offset;
    ret->align = align;
    ret->ptr = ptr;
    ret->type = type;
    ret->memory = memory;
    ret->finalize();
    return ret;
  }